

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::MILSpec::TensorValue::clear_value(TensorValue *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  TensorValue_RepeatedStrings *this_00;
  ulong uStack_20;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001b0c03_default;
    this_00 = (TensorValue_RepeatedStrings *)(this->value_).floats_;
    if (this_00 != (TensorValue_RepeatedStrings *)0x0) {
      TensorValue_RepeatedFloats::~TensorValue_RepeatedFloats((TensorValue_RepeatedFloats *)this_00)
      ;
    }
    break;
  case 2:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001b0c03_default;
    this_00 = (TensorValue_RepeatedStrings *)(this->value_).ints_;
    if (this_00 != (TensorValue_RepeatedStrings *)0x0) {
      TensorValue_RepeatedInts::~TensorValue_RepeatedInts((TensorValue_RepeatedInts *)this_00);
    }
    break;
  case 3:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001b0c03_default;
    this_00 = (TensorValue_RepeatedStrings *)(this->value_).bools_;
    if (this_00 != (TensorValue_RepeatedStrings *)0x0) {
      TensorValue_RepeatedBools::~TensorValue_RepeatedBools((TensorValue_RepeatedBools *)this_00);
    }
    break;
  case 4:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001b0c03_default;
    this_00 = (this->value_).strings_;
    if (this_00 != (TensorValue_RepeatedStrings *)0x0) {
      TensorValue_RepeatedStrings::~TensorValue_RepeatedStrings(this_00);
    }
    uStack_20 = 0x30;
    goto LAB_001b0d2c;
  case 5:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001b0c03_default;
    this_00 = (TensorValue_RepeatedStrings *)(this->value_).longints_;
    if (this_00 != (TensorValue_RepeatedStrings *)0x0) {
      TensorValue_RepeatedLongInts::~TensorValue_RepeatedLongInts
                ((TensorValue_RepeatedLongInts *)this_00);
    }
    break;
  case 6:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001b0c03_default;
    this_00 = (TensorValue_RepeatedStrings *)(this->value_).doubles_;
    if (this_00 != (TensorValue_RepeatedStrings *)0x0) {
      TensorValue_RepeatedDoubles::~TensorValue_RepeatedDoubles
                ((TensorValue_RepeatedDoubles *)this_00);
    }
    break;
  case 7:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001b0c03_default;
    this_00 = (TensorValue_RepeatedStrings *)(this->value_).bytes_;
    if (this_00 != (TensorValue_RepeatedStrings *)0x0) {
      TensorValue_RepeatedBytes::~TensorValue_RepeatedBytes((TensorValue_RepeatedBytes *)this_00);
    }
    uStack_20 = 0x20;
    goto LAB_001b0d2c;
  default:
    goto switchD_001b0c03_default;
  }
  uStack_20 = 0x28;
LAB_001b0d2c:
  operator_delete(this_00,uStack_20);
switchD_001b0c03_default:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void TensorValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.MILSpec.TensorValue)
  switch (value_case()) {
    case kFloats: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.floats_;
      }
      break;
    }
    case kInts: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.ints_;
      }
      break;
    }
    case kBools: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.bools_;
      }
      break;
    }
    case kStrings: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.strings_;
      }
      break;
    }
    case kLongInts: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.longints_;
      }
      break;
    }
    case kDoubles: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.doubles_;
      }
      break;
    }
    case kBytes: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.bytes_;
      }
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}